

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void convolve_no_maxpool_padding_replicate
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,int cstep,
               int ii_shift,int jj_shift,int channel_step)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  long in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  int clamped_jj;
  int jj;
  int clamped_ii;
  int ii;
  int off;
  int k;
  float sum;
  int upper_jj_index;
  int out_index;
  int w;
  int upper_ii_index;
  int out_h;
  int u;
  int h;
  int i;
  int end_w;
  int end_h;
  int start_w;
  int start_h;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_70;
  int local_68;
  int local_64;
  int local_60;
  float local_5c;
  int local_54;
  int local_50;
  int local_44;
  int local_40;
  int local_3c;
  
  iVar2 = get_start_shift_convolve(in_EDX,in_R8[2],in_R8[5]);
  iVar3 = get_start_shift_convolve(in_ESI,in_R8[1],in_R8[4]);
  for (local_3c = in_stack_00000010; local_3c < in_R8[3]; local_3c = upper_jj_index + local_3c) {
    local_44 = 0;
    for (local_40 = iVar2 - ii; local_40 < in_EDX - ii; local_40 = in_R8[5] + local_40) {
      local_54 = local_44 * in_stack_00000008;
      iVar1 = in_R8[2];
      for (local_50 = iVar3 - k; local_50 < in_ESI - k; local_50 = in_R8[4] + local_50) {
        local_5c = *(float *)(*(long *)(in_R8 + 10) + (long)local_3c * 4);
        for (local_60 = 0; local_60 < *in_R8; local_60 = local_60 + 1) {
          local_64 = local_60 * in_R8[3] + local_3c;
          for (local_68 = local_40; local_68 < iVar1 + local_40; local_68 = local_68 + 1) {
            if (local_68 < 0) {
              local_78 = 0;
            }
            else {
              if (local_68 < in_EDX) {
                local_7c = local_68;
              }
              else {
                local_7c = in_EDX + -1;
              }
              local_78 = local_7c;
            }
            for (local_70 = local_50; local_70 < in_R8[1] + local_50; local_70 = local_70 + 1) {
              if (local_70 < 0) {
                local_80 = 0;
              }
              else {
                if (local_70 < in_ESI) {
                  local_84 = local_70;
                }
                else {
                  local_84 = in_ESI + -1;
                }
                local_80 = local_84;
              }
              local_5c = *(float *)(*(long *)(in_R8 + 8) + (long)local_64 * 4) *
                         *(float *)(*(long *)(in_RDI + (long)local_60 * 8) +
                                   (long)(local_78 * in_ECX + local_80) * 4) + local_5c;
              local_64 = jj + local_64;
            }
          }
        }
        *(float *)(*(long *)(in_R9 + (long)local_3c * 8) + (long)local_54 * 4) = local_5c;
        local_54 = local_54 + 1;
      }
      local_44 = local_44 + 1;
    }
  }
  return;
}

Assistant:

static void convolve_no_maxpool_padding_replicate(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *const layer_config, float **output, int out_stride,
    int start_idx, const int cstep, const int ii_shift, const int jj_shift,
    const int channel_step) {
  // h and w are shifted to an offset coordinate system to reduce in-loop
  // computation.
  const int start_h =
      get_start_shift_convolve(in_height, layer_config->filter_height,
                               layer_config->skip_height) -
      ii_shift;
  const int start_w =
      get_start_shift_convolve(in_width, layer_config->filter_width,
                               layer_config->skip_width) -
      jj_shift;
  const int end_h = in_height - ii_shift;
  const int end_w = in_width - jj_shift;
  for (int i = start_idx; i < layer_config->out_channels; i += channel_step) {
    for (int h = start_h, u = 0; h < end_h;
         h += layer_config->skip_height, ++u) {
      const int out_h = u * out_stride;
      const int upper_ii_index = layer_config->filter_height + h;
      for (int w = start_w, out_index = out_h; w < end_w;
           w += layer_config->skip_width, ++out_index) {
        const int upper_jj_index = layer_config->filter_width + w;
        float sum = layer_config->bias[i];
        for (int k = 0; k < layer_config->in_channels; ++k) {
          int off = k * layer_config->out_channels + i;
          for (int ii = h; ii < upper_ii_index; ++ii) {
            const int clamped_ii = CLAMPINDEX(ii, in_height);
            for (int jj = w; jj < upper_jj_index; ++jj) {
              const int clamped_jj = CLAMPINDEX(jj, in_width);
              assert(clamped_ii >= 0 && clamped_ii < in_height &&
                     clamped_jj >= 0 && clamped_jj < in_width);
              sum += layer_config->weights[off] *
                     input[k][clamped_ii * in_stride + clamped_jj];
              off += cstep;
            }
          }
        }
        output[i][out_index] = sum;
      }
    }
  }
}